

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userauth.c
# Opt level: O0

int memory_read_publickey
              (LIBSSH2_SESSION *session,uchar **method,size_t *method_len,uchar **pubkeydata,
              size_t *pubkeydata_len,char *pubkeyfiledata,size_t pubkeyfiledata_len)

{
  int iVar1;
  ushort **ppuVar2;
  bool bVar3;
  size_t local_70;
  size_t tmp_len;
  size_t pubkey_len;
  uchar *tmp;
  uchar *sp2;
  uchar *sp1;
  uchar *pubkey;
  char *pubkeyfiledata_local;
  size_t *pubkeydata_len_local;
  uchar **pubkeydata_local;
  size_t *method_len_local;
  uchar **method_local;
  LIBSSH2_SESSION *session_local;
  
  sp1 = (uchar *)0x0;
  tmp_len = pubkeyfiledata_len;
  pubkey = (uchar *)pubkeyfiledata;
  pubkeyfiledata_local = (char *)pubkeydata_len;
  pubkeydata_len_local = (size_t *)pubkeydata;
  pubkeydata_local = (uchar **)method_len;
  method_len_local = (size_t *)method;
  method_local = (uchar **)session;
  if (pubkeyfiledata_len < 2) {
    session_local._4_4_ = _libssh2_error(session,-0x10,"Invalid data in public key file");
  }
  else {
    sp1 = (uchar *)(*session->alloc)(pubkeyfiledata_len,&session->abstract);
    if (sp1 == (uchar *)0x0) {
      session_local._4_4_ =
           _libssh2_error((LIBSSH2_SESSION *)method_local,-6,
                          "Unable to allocate memory for public key data");
    }
    else {
      memcpy(sp1,pubkey,pubkeyfiledata_len);
      while( true ) {
        bVar3 = false;
        if (tmp_len != 0) {
          ppuVar2 = __ctype_b_loc();
          bVar3 = ((*ppuVar2)[(int)(uint)sp1[tmp_len - 1]] & 0x2000) != 0;
        }
        if (!bVar3) break;
        tmp_len = tmp_len - 1;
      }
      if (tmp_len == 0) {
        (*(code *)method_local[3])(sp1,method_local);
        session_local._4_4_ =
             _libssh2_error((LIBSSH2_SESSION *)method_local,-0x10,"Missing public key data");
      }
      else {
        sp2 = (uchar *)memchr(sp1,0x20,tmp_len);
        if (sp2 == (uchar *)0x0) {
          (*(code *)method_local[3])(sp1,method_local);
          session_local._4_4_ =
               _libssh2_error((LIBSSH2_SESSION *)method_local,-0x10,"Invalid public key data");
        }
        else {
          sp2 = sp2 + 1;
          tmp = (uchar *)memchr(sp2,0x20,tmp_len - ((long)sp2 - (long)sp1));
          if (tmp == (uchar *)0x0) {
            tmp = sp1 + tmp_len;
          }
          iVar1 = _libssh2_base64_decode
                            ((LIBSSH2_SESSION *)method_local,(char **)&pubkey_len,&local_70,
                             (char *)sp2,(long)tmp - (long)sp2);
          if (iVar1 == 0) {
            *method_len_local = (size_t)sp1;
            *pubkeydata_local = sp2 + (-1 - (long)sp1);
            *pubkeydata_len_local = pubkey_len;
            *(size_t *)pubkeyfiledata_local = local_70;
            session_local._4_4_ = 0;
          }
          else {
            (*(code *)method_local[3])(sp1,method_local);
            session_local._4_4_ =
                 _libssh2_error((LIBSSH2_SESSION *)method_local,-0x10,
                                "Invalid key data, not base64 encoded");
          }
        }
      }
    }
  }
  return session_local._4_4_;
}

Assistant:

static int
memory_read_publickey(LIBSSH2_SESSION * session, unsigned char **method,
                      size_t *method_len,
                      unsigned char **pubkeydata,
                      size_t *pubkeydata_len,
                      const char *pubkeyfiledata,
                      size_t pubkeyfiledata_len)
{
    unsigned char *pubkey = NULL, *sp1, *sp2, *tmp;
    size_t pubkey_len = pubkeyfiledata_len;
    size_t tmp_len;

    if(pubkeyfiledata_len <= 1) {
        return _libssh2_error(session, LIBSSH2_ERROR_FILE,
                              "Invalid data in public key file");
    }

    pubkey = LIBSSH2_ALLOC(session, pubkeyfiledata_len);
    if(!pubkey) {
        return _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                              "Unable to allocate memory for public key data");
    }

    memcpy(pubkey, pubkeyfiledata, pubkeyfiledata_len);

    /*
     *   Remove trailing whitespace
     */
    while(pubkey_len && isspace(pubkey[pubkey_len - 1]))
        pubkey_len--;

    if(!pubkey_len) {
        LIBSSH2_FREE(session, pubkey);
        return _libssh2_error(session, LIBSSH2_ERROR_FILE,
                              "Missing public key data");
    }

    sp1 = memchr(pubkey, ' ', pubkey_len);
    if(!sp1) {
        LIBSSH2_FREE(session, pubkey);
        return _libssh2_error(session, LIBSSH2_ERROR_FILE,
                              "Invalid public key data");
    }

    sp1++;

    sp2 = memchr(sp1, ' ', pubkey_len - (sp1 - pubkey));
    if(!sp2) {
        /* Assume that the id string is missing, but that it's okay */
        sp2 = pubkey + pubkey_len;
    }

    if(_libssh2_base64_decode(session, (char **)&tmp, &tmp_len,
                              (const char *)sp1,
                              sp2 - sp1)) {
        LIBSSH2_FREE(session, pubkey);
        return _libssh2_error(session, LIBSSH2_ERROR_FILE,
                              "Invalid key data, not base64 encoded");
    }

    /* Wasting some bytes here (okay, more than some), but since it's likely
     * to be freed soon anyway, we'll just avoid the extra free/alloc and call
     * it a wash
     */
    *method = pubkey;
    *method_len = sp1 - pubkey - 1;

    *pubkeydata = tmp;
    *pubkeydata_len = tmp_len;

    return 0;
}